

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_class_skill_disarm_phys(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"base");
    *(wchar_t *)((long)pvVar3 + 0x7c) = wVar1;
    wVar1 = parser_getint(p,"incr");
    *(wchar_t *)((long)pvVar3 + 0xa4) = wVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_class_skill_disarm_phys(struct parser *p) {
	struct player_class *c = parser_priv(p);
	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	c->c_skills[SKILL_DISARM_PHYS] = parser_getint(p, "base");
	c->x_skills[SKILL_DISARM_PHYS] = parser_getint(p, "incr");
	return PARSE_ERROR_NONE;
}